

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriter.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::SscWriter::DoPutDeferred
          (SscWriter *this,Variable<unsigned_int> *variable,uint32_t *data)

{
  element_type *peVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  allocator local_8b;
  allocator local_8a;
  allocator local_89;
  ScopedTimer __var2118;
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  if (DoPutDeferred(adios2::core::Variable<unsigned_int>&,unsigned_int_const*)::__var118 == '\0') {
    iVar2 = __cxa_guard_acquire(&DoPutDeferred(adios2::core::Variable<unsigned_int>&,unsigned_int_const*)
                                 ::__var118);
    if (iVar2 != 0) {
      uVar4 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/ssc/SscWriter.cpp"
                                  ,
                                  "virtual void adios2::core::engine::SscWriter::DoPutDeferred(Variable<uint32_t> &, const uint32_t *)"
                                  ,0x76);
      DoPutDeferred::__var118 = (void *)ps_timer_create_(uVar4);
      __cxa_guard_release(&DoPutDeferred(adios2::core::Variable<unsigned_int>&,unsigned_int_const*)
                           ::__var118);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&__var2118,DoPutDeferred::__var118);
  std::__cxx11::string::string(local_40,"Engine",&local_89);
  std::__cxx11::string::string(local_60,"SscWriter",&local_8a);
  std::__cxx11::string::string(local_80,"DoPutDeferred",&local_8b);
  iVar2 = 0;
  if (9 < this->m_Verbosity) {
    iVar2 = adios2::helper::Comm::Rank();
  }
  iVar3 = adios2::helper::Comm::Rank();
  adios2::helper::Log(local_40,local_60,local_80,(string *)(variable + 8),iVar2,iVar3,5,
                      this->m_Verbosity,INFO);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  peVar1 = (this->m_EngineInstance).
           super___shared_ptr<adios2::core::engine::ssc::SscWriterBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar1->_vptr_SscWriterBase[7])(peVar1,variable,data);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2118);
  return;
}

Assistant:

void SscWriter::DoPutStructSync(VariableStruct &variable, const void *data)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();
    helper::Log("Engine", "SscWriter", "DoPutSync", variable.m_Name,
                m_Verbosity >= 10 ? m_Comm.Rank() : 0, m_Comm.Rank(), 5, m_Verbosity,
                helper::LogMode::INFO);
    m_EngineInstance->PutDeferred(variable, data);
    m_EngineInstance->PerformPuts();
}